

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olc_act.c
# Opt level: O3

bool aedit_uvnum(CHAR_DATA *ch,char *argument)

{
  short sVar1;
  AREA_DATA_conflict *pAVar2;
  AREA_DATA_conflict *pAVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  AREA_DATA_conflict *pAVar7;
  AREA_DATA_conflict **ppAVar8;
  char *txt;
  char upper [4608];
  char local_1228 [4616];
  
  pAVar2 = (AREA_DATA_conflict *)ch->desc->pEdit;
  one_argument(argument,local_1228);
  bVar4 = is_number(local_1228);
  if ((bVar4) && (local_1228[0] != '\0')) {
    sVar1 = pAVar2->min_vnum;
    iVar5 = atoi(local_1228);
    if (iVar5 < sVar1) {
      txt = "AEdit:  Upper must be larger then lower.\n\r";
    }
    else {
      iVar6 = 0;
      ppAVar8 = &area_first;
      do {
        ppAVar8 = &((AREA_DATA_conflict *)ppAVar8)->next->next;
        pAVar3 = area_first;
        if ((AREA_DATA_conflict *)ppAVar8 == (AREA_DATA_conflict *)0x0) goto joined_r0x0035bacc;
        if ((sVar1 <= ((AREA_DATA_conflict *)ppAVar8)->min_vnum &&
             ((AREA_DATA_conflict *)ppAVar8)->min_vnum <= iVar5) ||
           (((AREA_DATA_conflict *)ppAVar8)->max_vnum <= iVar5 &&
            sVar1 <= ((AREA_DATA_conflict *)ppAVar8)->max_vnum)) {
          iVar6 = iVar6 + 1;
        }
      } while (iVar6 < 2);
      txt = "AEdit:  Range must include only this area.\n\r";
    }
  }
  else {
    txt = "Syntax:  max_vnum [#xupper]\n\r";
  }
  goto LAB_0035ba5a;
joined_r0x0035bacc:
  if (pAVar3 == (AREA_DATA_conflict *)0x0) goto LAB_0035bae9;
  if ((pAVar3->min_vnum <= iVar5) && (pAVar7 = area_first, iVar5 <= pAVar3->max_vnum))
  goto LAB_0035bb04;
  pAVar3 = pAVar3->next;
  goto joined_r0x0035bacc;
  while (pAVar7 = pAVar7->next, pAVar7 != (AREA_DATA_conflict *)0x0) {
LAB_0035bb04:
    if ((pAVar7->min_vnum <= iVar5) && (iVar5 <= pAVar7->max_vnum)) goto LAB_0035bb1e;
  }
  pAVar7 = (AREA_DATA_conflict *)0x0;
LAB_0035bb1e:
  if (pAVar7 == pAVar2) {
LAB_0035bae9:
    pAVar2->max_vnum = (short)iVar5;
    send_to_char("Upper vnum set.\n\r",ch);
    return true;
  }
  txt = "AEdit:  Upper vnum already assigned.\n\r";
LAB_0035ba5a:
  send_to_char(txt,ch);
  return false;
}

Assistant:

bool aedit_uvnum(CHAR_DATA *ch, char *argument)
{
	AREA_DATA *pArea;
	char upper[MAX_STRING_LENGTH];
	int ilower;
	int iupper;

	EDIT_AREA(ch, pArea);

	one_argument(argument, upper);

	if (!is_number(upper) || upper[0] == '\0')
	{
		send_to_char("Syntax:  max_vnum [#xupper]\n\r", ch);
		return false;
	}

	if ((ilower = pArea->min_vnum) > (iupper = atoi(upper)))
	{
		send_to_char("AEdit:  Upper must be larger then lower.\n\r", ch);
		return false;
	}

	if (!check_range(ilower, iupper))
	{
		send_to_char("AEdit:  Range must include only this area.\n\r", ch);
		return false;
	}

	if (get_vnum_area(iupper) && get_vnum_area(iupper) != pArea)
	{
		send_to_char("AEdit:  Upper vnum already assigned.\n\r", ch);
		return false;
	}

	pArea->max_vnum = iupper;
	send_to_char("Upper vnum set.\n\r", ch);

	return true;
}